

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_params_util.hpp
# Opt level: O0

IParamTestSuiteInfo * __thiscall
iutest::detail::ParamTestSuiteHolder::FindTestSuitePatternHolder<std::__cxx11::string>
          (ParamTestSuiteHolder *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *testsuite,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *package)

{
  bool bVar1;
  reference ppIVar2;
  __normal_iterator<iutest::detail::IParamTestSuiteInfo_**,_std::vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>_>
  local_38;
  iterator end;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *package_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *testsuite_local;
  ParamTestSuiteHolder *this_local;
  
  end = std::
        vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
        ::begin(&this->m_testsuite_infos);
  local_38._M_current =
       (IParamTestSuiteInfo **)
       std::
       vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>
       ::end(&this->m_testsuite_infos);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&end,&local_38);
    if (!bVar1) {
      return (IParamTestSuiteInfo *)0x0;
    }
    ppIVar2 = __gnu_cxx::
              __normal_iterator<iutest::detail::IParamTestSuiteInfo_**,_std::vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>_>
              ::operator*(&end);
    bVar1 = IParamTestSuiteInfo::is_same(*ppIVar2,testsuite,package);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<iutest::detail::IParamTestSuiteInfo_**,_std::vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>_>
    ::operator++(&end);
  }
  ppIVar2 = __gnu_cxx::
            __normal_iterator<iutest::detail::IParamTestSuiteInfo_**,_std::vector<iutest::detail::IParamTestSuiteInfo_*,_std::allocator<iutest::detail::IParamTestSuiteInfo_*>_>_>
            ::operator*(&end);
  return *ppIVar2;
}

Assistant:

IParamTestSuiteInfo* FindTestSuitePatternHolder(const T& testsuite, const T& package)
    {
        for( TestSuiteInfoContainer::iterator it=m_testsuite_infos.begin(), end=m_testsuite_infos.end(); it != end; ++it )
        {
            if( (*it)->is_same(testsuite, package) )
            {
                return (*it);
            }
        }
        return NULL;
    }